

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall
wasm::BinaryInstWriter::visitStructCmpxchg(BinaryInstWriter *this,StructCmpxchg *curr)

{
  WasmBinaryWriter *this_00;
  bool bVar1;
  BufferWithRandomAccess *this_01;
  HeapType type;
  
  bVar1 = wasm::Type::isNull(&curr->ref->type);
  if (bVar1) {
    emitUnreachable(this);
    return;
  }
  this_01 = BufferWithRandomAccess::operator<<(this->o,-2);
  BufferWithRandomAccess::operator<<(this_01,(U32LEB)0x66);
  WasmBinaryWriter::writeMemoryOrder(this->parent,curr->order,true);
  this_00 = this->parent;
  type = wasm::Type::getHeapType(&curr->ref->type);
  WasmBinaryWriter::writeIndexedHeapType(this_00,type);
  BufferWithRandomAccess::operator<<(this->o,(U32LEB)curr->index);
  return;
}

Assistant:

void BinaryInstWriter::visitStructCmpxchg(StructCmpxchg* curr) {
  if (curr->ref->type.isNull()) {
    emitUnreachable();
    return;
  }
  o << int8_t(BinaryConsts::AtomicPrefix)
    << U32LEB(BinaryConsts::StructAtomicRMWCmpxchg);
  parent.writeMemoryOrder(curr->order, /*isRMW=*/true);
  parent.writeIndexedHeapType(curr->ref->type.getHeapType());
  o << U32LEB(curr->index);
}